

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathRegisterFuncNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri,xmlXPathFunction f)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  void *payload;
  int ret;
  xmlXPathFunction f_local;
  xmlChar *ns_uri_local;
  xmlChar *name_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else if (name == (xmlChar *)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->funcHash == (xmlHashTablePtr)0x0) {
      pxVar2 = xmlHashCreate(0);
      ctxt->funcHash = pxVar2;
    }
    if (ctxt->funcHash == (xmlHashTablePtr)0x0) {
      xmlXPathErrMemory(ctxt);
      ctxt_local._4_4_ = -1;
    }
    else if (f == (xmlXPathFunction)0x0) {
      ctxt_local._4_4_ = xmlHashRemoveEntry2(ctxt->funcHash,name,ns_uri,(xmlHashDeallocator)0x0);
    }
    else {
      iVar1 = xmlHashAddEntry2(ctxt->funcHash,name,ns_uri,f);
      if (iVar1 < 0) {
        xmlXPathErrMemory(ctxt);
        ctxt_local._4_4_ = -1;
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathRegisterFuncNS(xmlXPathContextPtr ctxt, const xmlChar *name,
		       const xmlChar *ns_uri, xmlXPathFunction f) {
    int ret;
    void *payload;

    if (ctxt == NULL)
	return(-1);
    if (name == NULL)
	return(-1);

    if (ctxt->funcHash == NULL)
	ctxt->funcHash = xmlHashCreate(0);
    if (ctxt->funcHash == NULL) {
        xmlXPathErrMemory(ctxt);
	return(-1);
    }
    if (f == NULL)
        return(xmlHashRemoveEntry2(ctxt->funcHash, name, ns_uri, NULL));
    memcpy(&payload, &f, sizeof(f));
    ret = xmlHashAddEntry2(ctxt->funcHash, name, ns_uri, payload);
    if (ret < 0) {
        xmlXPathErrMemory(ctxt);
        return(-1);
    }

    return(0);
}